

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLText * __thiscall tinyxml2::XMLDocument::NewText(XMLDocument *this,char *str)

{
  XMLDocument *doc;
  XMLNode *in_RSI;
  XMLText *in_RDI;
  MemPoolT<96> *unaff_retaddr;
  XMLText *text;
  
  doc = (XMLDocument *)MemPoolT<96>::Alloc(unaff_retaddr);
  XMLText::XMLText(in_RDI,doc);
  (doc->super_XMLNode)._memPool = (MemPool *)(in_RDI + 4);
  XMLNode::SetValue(in_RSI,(char *)doc,SUB81((ulong)in_RDI >> 0x38,0));
  return (XMLText *)doc;
}

Assistant:

XMLText* XMLDocument::NewText( const char* str )
{
    TIXMLASSERT( sizeof( XMLText ) == _textPool.ItemSize() );
    XMLText* text = new (_textPool.Alloc()) XMLText( this );
    text->_memPool = &_textPool;
    text->SetValue( str );
    return text;
}